

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leccalc.cpp
# Opt level: O0

void leccalc::processinputfile
               (uint *samplesize,
               map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
               *event_to_periods,set<int,_std::less<int>,_std::allocator<int>_> *summaryids,
               vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
               *out_loss,bool useReturnPeriodFile,aggreports *agg)

{
  int sidx;
  float loss;
  int summary_id;
  bool bVar1;
  pointer ppVar2;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar3;
  int local_80;
  float local_7c;
  sampleslevelRec sr_1;
  int local_68 [2];
  sampleslevelRec sr;
  _Self local_58;
  const_iterator iter;
  int local_48;
  summarySampleslevelHeader sh;
  size_t i;
  aggreports *agg_local;
  bool useReturnPeriodFile_local;
  vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
  *out_loss_local;
  set<int,_std::less<int>,_std::allocator<int>_> *summaryids_local;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *event_to_periods_local;
  uint *samplesize_local;
  
  checkinputfile(samplesize,(FILE *)_stdin,agg);
  sh.summary_id = 1;
  sh.expval = 0.0;
  do {
    while( true ) {
      if ((sh._4_8_ == 0) ||
         (sh._4_8_ = fread((void *)((long)&iter._M_node + 4),0xc,1,_stdin), sh._4_8_ != 1)) {
        return;
      }
      local_58._M_node =
           (_Base_ptr)
           std::
           map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
           ::find(event_to_periods,(key_type *)((long)&iter._M_node + 4));
      sr = (sampleslevelRec)
           std::
           map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
           ::end(event_to_periods);
      bVar1 = std::operator==(&local_58,(_Self *)&sr);
      if (bVar1) break;
      pVar3 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert(summaryids,&local_48);
      sr_1 = (sampleslevelRec)pVar3.first._M_node;
      while (((sh._4_8_ != 0 &&
              (sh._4_8_ = fread(&local_80,8,1,_stdin), summary_id = local_48, loss = local_7c,
              sidx = local_80, sh._4_8_ == 1)) && (local_80 != 0))) {
        if (((local_80 != -4) && (local_80 != -5)) && ((0.0 < local_7c || (useReturnPeriodFile)))) {
          ppVar2 = std::
                   _Rb_tree_const_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                   ::operator->(&local_58);
          dolecoutputaggsummary(summary_id,sidx,loss,&ppVar2->second,out_loss);
        }
      }
    }
    do {
      if ((sh._4_8_ == 0) || (sh._4_8_ = fread(local_68,8,1,_stdin), sh._4_8_ != 1)) break;
    } while (local_68[0] != 0);
  } while( true );
}

Assistant:

void processinputfile(
		unsigned int& samplesize,
		const std::map<int, std::vector<int> >& event_to_periods,
		std::set<int> &summaryids,
		std::vector<std::map<outkey2, OutLosses>> &out_loss,
		const bool useReturnPeriodFile, aggreports &agg)
	{
		checkinputfile(samplesize, stdin, agg);

		// read_event()
		size_t i = 1;
		while (i != 0) {
			summarySampleslevelHeader sh;
			i = fread(&sh, sizeof(sh), 1, stdin);
			if (i != 1) {
				break;
			}

			// discard samples if eventis not found
			std::map<int, std::vector<int> >::const_iterator iter = event_to_periods.find(sh.event_id);
			if (iter == event_to_periods.end()) { // Event not found so don't process it, but read samples
				while (i != 0) {
					sampleslevelRec sr;
					i = fread(&sr, sizeof(sr), 1, stdin);
					if (i != 1 || sr.sidx == 0) {
						break;
					}
				}
				continue;
			}

			summaryids.insert(sh.summary_id);

			// read_samples_and_compute_lec()
			while (i != 0) {
				sampleslevelRec sr;
				i = fread(&sr, sizeof(sr), 1, stdin);
				if (i != 1) {
					break;
				}

				if (sr.sidx == 0) {			//  end of sidx stream
					break;
				}

				if (sr.sidx == number_of_affected_risk_idx || sr.sidx == max_loss_idx) {
					continue;
				}

				if (sr.loss > 0.0 || useReturnPeriodFile)
				{
					dolecoutputaggsummary(sh.summary_id, sr.sidx, sr.loss, iter->second, out_loss);
				}
			}
		}
	}